

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

void anon_unknown.dwarf_3c4::PrintCommands(Edge *edge,EdgeSet *seen,PrintCommandMode mode)

{
  bool bVar1;
  reference ppNVar2;
  Edge *edge_00;
  char *__s;
  pair<std::_Rb_tree_const_iterator<Edge_*>,_bool> pVar3;
  string local_70;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_50;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_48;
  iterator in;
  PrintCommandMode mode_local;
  EdgeSet *seen_local;
  Edge *edge_local;
  
  if (edge != (Edge *)0x0) {
    seen_local = (EdgeSet *)edge;
    pVar3 = std::set<Edge_*,_EdgeCmp,_std::allocator<Edge_*>_>::insert
                      (seen,(value_type *)&seen_local);
    in._M_current = (Node **)pVar3.first._M_node;
    if (((pVar3.second ^ 0xffU) & 1) == 0) {
      if (mode == PCM_All) {
        local_48._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 &(seen_local->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                  _M_parent);
        while( true ) {
          local_50._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)
                                   &(seen_local->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                    _M_parent);
          bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
          if (!bVar1) break;
          ppNVar2 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_48);
          edge_00 = Node::in_edge(*ppNVar2);
          PrintCommands(edge_00,seen,PCM_All);
          __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
          operator++(&local_48);
        }
      }
      bVar1 = Edge::is_phony((Edge *)seen_local);
      if (!bVar1) {
        Edge::EvaluateCommand_abi_cxx11_(&local_70,(Edge *)seen_local,false);
        __s = (char *)std::__cxx11::string::c_str();
        puts(__s);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  return;
}

Assistant:

void PrintCommands(Edge* edge, EdgeSet* seen, PrintCommandMode mode) {
  if (!edge)
    return;
  if (!seen->insert(edge).second)
    return;

  if (mode == PCM_All) {
    for (vector<Node*>::iterator in = edge->inputs_.begin();
         in != edge->inputs_.end(); ++in)
      PrintCommands((*in)->in_edge(), seen, mode);
  }

  if (!edge->is_phony())
    puts(edge->EvaluateCommand().c_str());
}